

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

IGeneratorInfo * __thiscall
Catch::GeneratorsForTest::getGeneratorInfo(GeneratorsForTest *this,string *fileInfo,size_t size)

{
  iterator iVar1;
  IGeneratorInfo *pIVar2;
  IGeneratorInfo *info;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>
  local_50;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>_>
          ::find(&(this->m_generatorsByName)._M_t,fileInfo);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->m_generatorsByName)._M_t._M_impl.super__Rb_tree_header) {
    pIVar2 = (IGeneratorInfo *)operator_new(0x18);
    pIVar2->_vptr_IGeneratorInfo = (_func_int **)&PTR__IGeneratorInfo_00143668;
    pIVar2[1]._vptr_IGeneratorInfo = (_func_int **)size;
    pIVar2[2]._vptr_IGeneratorInfo = (_func_int **)0x0;
    info = pIVar2;
    std::__cxx11::string::string((string *)&local_50,(string *)fileInfo);
    local_50.second = pIVar2;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::IGeneratorInfo*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>>>
                *)&this->m_generatorsByName,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>::push_back
              (&this->m_generatorsInOrder,&info);
  }
  else {
    info = *(IGeneratorInfo **)(iVar1._M_node + 2);
  }
  return info;
}

Assistant:

IGeneratorInfo& getGeneratorInfo( std::string const& fileInfo, std::size_t size ) {
            std::map<std::string, IGeneratorInfo*>::const_iterator it = m_generatorsByName.find( fileInfo );
            if( it == m_generatorsByName.end() ) {
                IGeneratorInfo* info = new GeneratorInfo( size );
                m_generatorsByName.insert( std::make_pair( fileInfo, info ) );
                m_generatorsInOrder.push_back( info );
                return *info;
            }
            return *it->second;
        }